

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O0

void __thiscall webrtc::SincResampler::UpdateRegions(SincResampler *this,bool second_load)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  bool second_load_local;
  SincResampler *this_local;
  
  pfVar1 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::get(&this->input_buffer_);
  lVar3 = 0x10;
  if (second_load) {
    lVar3 = 0x20;
  }
  this->r0_ = pfVar1 + lVar3;
  this->r3_ = this->r0_ + (this->request_frames_ - 0x20);
  this->r4_ = this->r0_ + (this->request_frames_ - 0x10);
  this->block_size_ = (long)this->r4_ - (long)this->r2_ >> 2;
  pfVar1 = this->r1_;
  pfVar2 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::get(&this->input_buffer_);
  if (pfVar1 != pfVar2) {
    __assert_fail("r1_ == input_buffer_.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                  ,0xc9,"void webrtc::SincResampler::UpdateRegions(bool)");
  }
  if ((long)this->r2_ - (long)this->r1_ >> 2 != (long)this->r4_ - (long)this->r3_ >> 2) {
    __assert_fail("r2_ - r1_ == r4_ - r3_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                  ,0xcb,"void webrtc::SincResampler::UpdateRegions(bool)");
  }
  if (this->r2_ < this->r3_) {
    return;
  }
  __assert_fail("r2_ < r3_",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/resampler/sinc_resampler.cc"
                ,0xcd,"void webrtc::SincResampler::UpdateRegions(bool)");
}

Assistant:

void SincResampler::UpdateRegions(bool second_load) {
  // Setup various region pointers in the buffer (see diagram above).  If we're
  // on the second load we need to slide r0_ to the right by kKernelSize / 2.
  r0_ = input_buffer_.get() + (second_load ? kKernelSize : kKernelSize / 2);
  r3_ = r0_ + request_frames_ - kKernelSize;
  r4_ = r0_ + request_frames_ - kKernelSize / 2;
  block_size_ = r4_ - r2_;

  // r1_ at the beginning of the buffer.
  assert(r1_ == input_buffer_.get());
  // r1_ left of r2_, r4_ left of r3_ and size correct.
  assert(r2_ - r1_ == r4_ - r3_);
  // r2_ left of r3.
  assert(r2_ < r3_);
}